

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase679::run(TestCase679 *this)

{
  PromiseNode *pPVar1;
  PromiseNode *pPVar2;
  __pid_t _Var3;
  TransformPromiseNodeBase *pTVar4;
  Disposer *pDVar5;
  AttachmentPromiseNodeBase *this_00;
  bool destroyed;
  Promise<int> promise;
  WaitScope waitScope;
  EventLoop loop;
  char local_99;
  Own<kj::_::PromiseNode> local_98;
  Own<kj::_::PromiseNode> local_88;
  Own<kj::_::PromiseNode> local_78;
  EventLoop *local_68;
  undefined4 local_60;
  EventLoop local_58;
  
  local_99 = '\0';
  EventLoop::EventLoop(&local_58);
  local_60 = 0xffffffff;
  local_68 = &local_58;
  EventLoop::enterScope(&local_58);
  _::yield();
  pTVar4 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar4,&local_78,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:685:36),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  pPVar1 = local_78.ptr;
  (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00436178;
  pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_99;
  local_88.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase679::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_88.ptr = (PromiseNode *)pTVar4;
  if (local_78.ptr != (PromiseNode *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_),
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pDVar5 = (Disposer *)operator_new(8);
  pDVar5->_vptr_Disposer = (_func_int **)&local_99;
  this_00 = (AttachmentPromiseNodeBase *)operator_new(0x28);
  _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&local_88);
  pPVar1 = local_88.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00436200;
  this_00[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DestructorDetector>::instance;
  this_00[1].dependency.disposer = pDVar5;
  local_98.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>>>
        ::instance;
  local_98.ptr = (PromiseNode *)this_00;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  pTVar4 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar4,&local_98,
             _::
             TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:690:26),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  pDVar5 = local_98.disposer;
  (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004362b8;
  pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_99;
  local_98.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase679::run()::$_1,kj::_::PropagateException>>
        ::instance;
  if ((AttachmentPromiseNodeBase *)local_98.ptr != (AttachmentPromiseNodeBase *)0x0) {
    pPVar1 = (PromiseNode *)&(local_98.ptr)->_vptr_PromiseNode;
    pPVar2 = (PromiseNode *)&(local_98.ptr)->_vptr_PromiseNode;
    local_98.ptr = (PromiseNode *)pTVar4;
    (**pDVar5->_vptr_Disposer)
              (pDVar5,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
    pTVar4 = (TransformPromiseNodeBase *)local_98.ptr;
  }
  local_98.ptr = &pTVar4->super_PromiseNode;
  if ((local_99 == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2b7,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  _Var3 = Promise<int>::wait((Promise<int> *)&local_98,&local_68);
  if (_Var3 != 0x1bc && _::Debug::minSeverity < 3) {
    local_78.disposer._0_4_ = 0x1bc;
    _Var3 = Promise<int>::wait((Promise<int> *)&local_98,&local_68);
    local_88.disposer = (Disposer *)CONCAT44(local_88.disposer._4_4_,_Var3);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2b8,ERROR,
               "\"failed: expected \" \"(444) == (promise.wait(waitScope))\", 444, promise.wait(waitScope)"
               ,(char (*) [52])"failed: expected (444) == (promise.wait(waitScope))",
               (int *)&local_78,(int *)&local_88);
  }
  if ((local_99 == '\0') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2b9,ERROR,"\"failed: expected \" \"destroyed\"",
               (char (*) [27])"failed: expected destroyed");
  }
  pPVar1 = local_98.ptr;
  if ((TransformPromiseNodeBase *)local_98.ptr != (TransformPromiseNodeBase *)0x0) {
    local_98.ptr = (PromiseNode *)0x0;
    (**(local_98.disposer)->_vptr_Disposer)
              (local_98.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_68);
  EventLoop::~EventLoop(&local_58);
  return;
}

Assistant:

TEST(Async, Attach) {
  bool destroyed = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() {
    EXPECT_FALSE(destroyed);
    return 123;
  }).attach(kj::heap<DestructorDetector>(destroyed));

  promise = promise.then([&](int i) {
    EXPECT_TRUE(destroyed);
    return i + 321;
  });

  EXPECT_FALSE(destroyed);
  EXPECT_EQ(444, promise.wait(waitScope));
  EXPECT_TRUE(destroyed);
}